

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discover.cc
# Opt level: O2

void __thiscall rcdiscover::Discover::broadcastRequest(Discover *this)

{
  pointer ptVar1;
  pointer pSVar2;
  vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *__range1;
  pointer this_00;
  initializer_list<unsigned_char> __l;
  allocator_type local_59 [9];
  undefined8 local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> discovery_cmd;
  
  ptVar1 = (this->req_nums_).
           super__Vector_base<std::tuple<unsigned_char,_unsigned_char>,_std::allocator<std::tuple<unsigned_char,_unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->req_nums_).
      super__Vector_base<std::tuple<unsigned_char,_unsigned_char>,_std::allocator<std::tuple<unsigned_char,_unsigned_char>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ptVar1) {
    (this->req_nums_).
    super__Vector_base<std::tuple<unsigned_char,_unsigned_char>,_std::allocator<std::tuple<unsigned_char,_unsigned_char>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ptVar1;
  }
  local_50 = 0x2001142;
  __l._M_len = 8;
  __l._M_array = (iterator)&local_50;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&discovery_cmd,__l,local_59);
  pSVar2 = (this->sockets_).
           super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->sockets_).
                 super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pSVar2; this_00 = this_00 + 1
      ) {
    GigERequestCounter::getNext();
    std::
    vector<std::tuple<unsigned_char,unsigned_char>,std::allocator<std::tuple<unsigned_char,unsigned_char>>>
    ::emplace_back<std::tuple<unsigned_char,unsigned_char>>
              ((vector<std::tuple<unsigned_char,unsigned_char>,std::allocator<std::tuple<unsigned_char,unsigned_char>>>
                *)&this->req_nums_,(tuple<unsigned_char,_unsigned_char> *)&local_50);
    ptVar1 = (this->req_nums_).
             super__Vector_base<std::tuple<unsigned_char,_unsigned_char>,_std::allocator<std::tuple<unsigned_char,_unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    discovery_cmd.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[6] =
         ptVar1[-1].super__Tuple_impl<0UL,_unsigned_char,_unsigned_char>.
         super__Head_base<0UL,_unsigned_char,_false>._M_head_impl;
    discovery_cmd.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[7] =
         ptVar1[-1].super__Tuple_impl<0UL,_unsigned_char,_unsigned_char>.
         super__Tuple_impl<1UL,_unsigned_char>.super__Head_base<1UL,_unsigned_char,_false>.
         _M_head_impl;
    SocketLinux::sendImpl(this_00,&discovery_cmd);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&discovery_cmd.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void Discover::broadcastRequest()
{
  req_nums_.clear();

  std::vector<uint8_t> discovery_cmd{0x42, 0x11, 0, 0x02, 0, 0, 0, 0};

  for (auto &socket : sockets_)
  {
    req_nums_.push_back(GigERequestCounter::getNext());
    std::tie(discovery_cmd[6], discovery_cmd[7]) = req_nums_.back();

    try
    {
      socket.send(discovery_cmd);
    }
    catch(const NetworkUnreachableException &)
    {
      continue;
    }
  }
}